

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void mg_set_auth_handler(mg_context *ctx,char *uri,mg_authorization_handler handler,void *cbdata)

{
  mg_set_handler_type(ctx,&ctx->dd,uri,2,(uint)(handler == (mg_authorization_handler)0x0),
                      (mg_request_handler)0x0,(mg_websocket_subprotocols *)0x0,
                      (mg_websocket_connect_handler)0x0,(mg_websocket_ready_handler)0x0,
                      (mg_websocket_data_handler)0x0,(mg_websocket_close_handler)0x0,handler,cbdata)
  ;
  return;
}

Assistant:

CIVETWEB_API void
mg_set_auth_handler(struct mg_context *ctx,
                    const char *uri,
                    mg_authorization_handler handler,
                    void *cbdata)
{
	mg_set_handler_type(ctx,
	                    &(ctx->dd),
	                    uri,
	                    AUTH_HANDLER,
	                    handler == NULL,
	                    NULL,
	                    NULL,
	                    NULL,
	                    NULL,
	                    NULL,
	                    NULL,
	                    handler,
	                    cbdata);
}